

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::SubroutineSymbol::connectExternInterfacePrototype(SubroutineSymbol *this)

{
  SymbolKind SVar1;
  Scope *this_00;
  MethodPrototypeSymbol *this_01;
  ExternImpl *pEVar2;
  bool bVar3;
  InstanceSymbol *this_02;
  Symbol *pSVar4;
  Diagnostic *pDVar5;
  Diagnostic *this_03;
  ExternImpl *pEVar6;
  SourceLocation location;
  char *pcVar7;
  DiagCode code;
  DiagCode code_00;
  string_view name;
  SourceRange SVar8;
  IfaceConn IVar9;
  string_view arg;
  Token nameToken;
  ModportSymbol *local_50;
  Token local_40;
  
  if (this->prototype != (MethodPrototypeSymbol *)0x0) {
    return;
  }
  this_00 = (this->super_Symbol).parentScope;
  local_40 = slang::syntax::SyntaxNode::getFirstToken
                       (*(SyntaxNode **)((this->super_Symbol).originatingSyntax[3].parent + 5));
  name = parsing::Token::valueText(&local_40);
  this_02 = (InstanceSymbol *)Scope::find(this_00,name);
  if (this_02 == (InstanceSymbol *)0x0) {
    if (name._M_len == 0) {
      return;
    }
    SVar8 = parsing::Token::range(&local_40);
    code.subsystem = Lookup;
    code.code = 0x34;
  }
  else {
    SVar1 = (this_02->super_InstanceSymbolBase).super_Symbol.kind;
    if ((int)SVar1 < 0x31) {
      if (SVar1 == InterfacePort) {
        IVar9 = InterfacePortSymbol::getConnection((InterfacePortSymbol *)this_02);
        local_50 = IVar9.second;
        this_02 = (InstanceSymbol *)IVar9.first;
        if (this_02 == (InstanceSymbol *)0x0) {
LAB_00295099:
          this_02 = (InstanceSymbol *)0x0;
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if ((this_02->super_InstanceSymbolBase).super_Symbol.kind == InstanceArray) {
            SVar8 = parsing::Token::range(&local_40);
            Scope::addDiag(this_00,(DiagCode)0x3b0006,SVar8);
            goto LAB_00295099;
          }
        }
        if (!bVar3) {
          return;
        }
      }
      else {
        if ((SVar1 != Instance) || (bVar3 = InstanceSymbol::isInterface(this_02), !bVar3))
        goto LAB_0029502e;
        local_50 = (ModportSymbol *)0x0;
      }
      pSVar4 = Scope::find(&this_02->body->super_Scope,(this->super_Symbol).name);
      if (pSVar4 != (Symbol *)0x0) {
        if (pSVar4->kind == Subroutine) {
          if ((pSVar4[3].field_0x4 & 0x10) != 0) {
            this_01 = (MethodPrototypeSymbol *)pSVar4[4].name._M_str;
            if ((((this_01->flags).m_bits & 0x800) == 0) &&
               (this_01->firstExternImpl != (ExternImpl *)0x0)) {
              pDVar5 = Scope::addDiag(this_00,(DiagCode)0x300006,(this->super_Symbol).location);
              bVar3 = this->subroutineKind == Function;
              pcVar7 = "task";
              if (bVar3) {
                pcVar7 = "function";
              }
              arg._M_str = pcVar7;
              arg._M_len = (ulong)bVar3 * 4 + 4;
              Diagnostic::operator<<(pDVar5,arg);
              this_03 = Diagnostic::operator<<(pDVar5,name);
              Diagnostic::operator<<(this_03,(this->super_Symbol).name);
              Diagnostic::addNote(pDVar5,(DiagCode)0xa0001,
                                  (((this_01->firstExternImpl->impl).ptr)->super_Symbol).location);
            }
            pEVar6 = BumpAllocator::
                     emplace<slang::ast::MethodPrototypeSymbol::ExternImpl,slang::ast::SubroutineSymbol_const&>
                               (&((this_01->super_Scope).compilation)->super_BumpAllocator,this);
            pEVar2 = this_01->firstExternImpl;
            this_01->firstExternImpl = pEVar6;
            pEVar6->next = pEVar2;
            MethodPrototypeSymbol::checkMethodMatch(this_01,this_00,this);
            this->prototype = this_01;
            if (local_50 == (ModportSymbol *)0x0) {
              return;
            }
            if (local_50->hasExports != true) {
              return;
            }
            connectExternInterfacePrototype();
            return;
          }
          location = (this->super_Symbol).location;
          code_00.subsystem = Declarations;
          code_00.code = 0x42;
        }
        else {
          location = (this->super_Symbol).location;
          code_00.subsystem = Lookup;
          code_00.code = 0x23;
        }
        pDVar5 = Scope::addDiag(this_00,code_00,location);
        Diagnostic::operator<<(pDVar5,(this->super_Symbol).name);
        Diagnostic::addNote(pDVar5,(DiagCode)0x50001,pSVar4->location);
        return;
      }
      if ((this->super_Symbol).name._M_len == 0) {
        return;
      }
      pDVar5 = Scope::addDiag(this_00,(DiagCode)0x3a000a,(this->super_Symbol).location);
      pDVar5 = Diagnostic::operator<<(pDVar5,(this->super_Symbol).name);
      goto LAB_0029504b;
    }
    if (SVar1 == InstanceArray) {
      SVar8 = parsing::Token::range(&local_40);
      Scope::addDiag(this_00,(DiagCode)0x3b0006,SVar8);
      return;
    }
    if (SVar1 == UninstantiatedDef) {
      return;
    }
LAB_0029502e:
    SVar8 = parsing::Token::range(&local_40);
    code.subsystem = Lookup;
    code.code = 0x27;
  }
  pDVar5 = Scope::addDiag(this_00,code,SVar8);
LAB_0029504b:
  Diagnostic::operator<<(pDVar5,name);
  return;
}

Assistant:

void SubroutineSymbol::connectExternInterfacePrototype() const {
    if (prototype)
        return;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(scope && syntax);

    auto nameToken = syntax->as<FunctionDeclarationSyntax>().prototype->name->getFirstToken();
    auto ifaceName = nameToken.valueText();
    auto symbol = scope->find(ifaceName);
    if (!symbol) {
        if (!ifaceName.empty())
            scope->addDiag(diag::UndeclaredIdentifier, nameToken.range()) << ifaceName;
        return;
    }

    const InstanceSymbol* inst = nullptr;
    const ModportSymbol* modport = nullptr;
    if (symbol->kind == SymbolKind::InterfacePort) {
        const Symbol* conn;
        auto& port = symbol->as<InterfacePortSymbol>();
        std::tie(conn, modport) = port.getConnection();
        if (!conn)
            return;

        if (conn->kind == SymbolKind::InstanceArray) {
            scope->addDiag(diag::ExternIfaceArrayMethod, nameToken.range());
            return;
        }

        inst = &conn->as<InstanceSymbol>();
    }
    else if (symbol->kind == SymbolKind::Instance) {
        inst = &symbol->as<InstanceSymbol>();
        if (!inst->isInterface()) {
            scope->addDiag(diag::NotAnInterfaceOrPort, nameToken.range()) << ifaceName;
            return;
        }
    }
    else if (symbol->kind == SymbolKind::InstanceArray) {
        scope->addDiag(diag::ExternIfaceArrayMethod, nameToken.range());
        return;
    }
    else {
        if (symbol->kind != SymbolKind::UninstantiatedDef)
            scope->addDiag(diag::NotAnInterfaceOrPort, nameToken.range()) << ifaceName;
        return;
    }

    auto ifaceMethod = inst->body.find(name);
    if (!ifaceMethod) {
        if (!name.empty())
            scope->addDiag(diag::UnknownMember, location) << name << ifaceName;
        return;
    }

    if (ifaceMethod->kind != SymbolKind::Subroutine) {
        auto& diag = scope->addDiag(diag::NotASubroutine, location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, ifaceMethod->location);
        return;
    }

    auto& sub = ifaceMethod->as<SubroutineSymbol>();
    if (!sub.flags.has(MethodFlags::InterfaceExtern)) {
        auto& diag = scope->addDiag(diag::IfaceMethodNotExtern, location);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, ifaceMethod->location);
        return;
    }

    auto proto = sub.getPrototype();
    SLANG_ASSERT(proto);

    if (!proto->flags.has(MethodFlags::ForkJoin) && proto->getFirstExternImpl() != nullptr) {
        auto& diag = scope->addDiag(diag::DupInterfaceExternMethod, location);
        diag << (subroutineKind == SubroutineKind::Function ? "function"sv : "task"sv);
        diag << ifaceName << name;
        diag.addNote(diag::NotePreviousDefinition, proto->getFirstExternImpl()->impl->location);
    }

    proto->addExternImpl(*this);
    proto->checkMethodMatch(*scope, *this);
    prototype = proto;

    // If our connection goes through a modport that exports us we should register ourselves
    // as an implementation for that export to facilitate checking for missing exports later.
    if (modport && modport->hasExports) {
        if (auto it = modport->getNameMap().find(name); it != modport->getNameMap().end()) {
            if (it->second && it->second->kind == SymbolKind::MethodPrototype) {
                auto& modportProto = it->second->as<MethodPrototypeSymbol>();
                if (modportProto.flags.has(MethodFlags::ModportExport))
                    modportProto.addExternImpl(*this);
            }
        }
    }
}